

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeCommandListImmediateAppendCommandListsExpPrologue
          (ZEHandleLifetimeValidation *this,ze_command_list_handle_t hCommandListImmediate,
          uint32_t numCommandLists,ze_command_list_handle_t *phCommandLists,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hCommandListImmediate);
  if (!bVar2) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  bVar2 = numCommandLists == 0 || phCommandLists == (ze_command_list_handle_t *)0x0;
  if (numCommandLists != 0 && phCommandLists != (ze_command_list_handle_t *)0x0) {
    bVar3 = HandleLifetimeValidation::isHandleValid
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),*phCommandLists);
    if (bVar3) {
      uVar4 = 1;
      do {
        bVar2 = numCommandLists <= uVar4 || phCommandLists == (ze_command_list_handle_t *)0x0;
        if (bVar2) goto LAB_001a3ce0;
        bVar3 = HandleLifetimeValidation::isHandleValid
                          (*(HandleLifetimeValidation **)(lVar1 + 0xd48),phCommandLists[uVar4]);
        uVar4 = uVar4 + 1;
      } while (bVar3);
    }
    if (!bVar2) {
      return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
  }
LAB_001a3ce0:
  if ((hSignalEvent != (ze_event_handle_t)0x0) &&
     (bVar2 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hSignalEvent), !bVar2)) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (numWaitEvents != 0 && phWaitEvents != (ze_event_handle_t *)0x0) {
    uVar4 = 1;
    do {
      bVar2 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(lVar1 + 0xd48),phWaitEvents[uVar4 - 1]);
      if (!bVar2) {
        return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
      }
    } while ((phWaitEvents != (ze_event_handle_t *)0x0) &&
            (bVar2 = uVar4 < numWaitEvents, uVar4 = uVar4 + 1, bVar2));
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeCommandListImmediateAppendCommandListsExpPrologue(
        ze_command_list_handle_t hCommandListImmediate, ///< [in] handle of the immediate command list
        uint32_t numCommandLists,                       ///< [in] number of command lists
        ze_command_list_handle_t* phCommandLists,       ///< [in][range(0, numCommandLists)] handles of command lists
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
                                                        ///<    - if not null, this event is signaled after the completion of all
                                                        ///< appended command lists
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing appended
                                                        ///< command lists; must be 0 if nullptr == phWaitEvents
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing appended command lists.
                                                        ///<    - if not null, all wait events must be satisfied prior to the start
                                                        ///< of any appended command list(s)
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hCommandListImmediate )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phCommandLists) && (i < numCommandLists); ++i){
            if (!context.handleLifetime->isHandleValid( phCommandLists[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        if (hSignalEvent && !context.handleLifetime->isHandleValid( hSignalEvent )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phWaitEvents) && (i < numWaitEvents); ++i){
            if (!context.handleLifetime->isHandleValid( phWaitEvents[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        return ZE_RESULT_SUCCESS;
    }